

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_guarded_opt.hpp
# Opt level: O0

shared_handle * __thiscall
gmlc::libguarded::shared_guarded_opt<int,_std::shared_timed_mutex>::lock_shared
          (shared_handle *__return_storage_ptr__,
          shared_guarded_opt<int,_std::shared_timed_mutex> *this)

{
  shared_lock<std::shared_timed_mutex> local_28;
  shared_guarded_opt<int,_std::shared_timed_mutex> *local_18;
  shared_guarded_opt<int,_std::shared_timed_mutex> *this_local;
  
  local_18 = this;
  this_local = (shared_guarded_opt<int,_std::shared_timed_mutex> *)__return_storage_ptr__;
  if ((this->enabled & 1U) == 0) {
    std::shared_lock<std::shared_timed_mutex>::shared_lock(&local_28);
    shared_lock_handle<int,_std::shared_timed_mutex>::shared_lock_handle
              (__return_storage_ptr__,&this->m_obj,&local_28);
    std::shared_lock<std::shared_timed_mutex>::~shared_lock(&local_28);
  }
  else {
    shared_lock_handle<int,_std::shared_timed_mutex>::shared_lock_handle
              (__return_storage_ptr__,&this->m_obj,&this->m_mutex);
  }
  return __return_storage_ptr__;
}

Assistant:

auto shared_guarded_opt<T, M>::lock_shared() const -> shared_handle
{
    return (enabled) ?
        shared_handle(&m_obj, m_mutex) :
        shared_handle(&m_obj, typename shared_locker<M>::locker_type{});
}